

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::UnitTest::set_current_test_info(UnitTest *this,TestInfo *a_current_test_info)

{
  GTestMutexLock local_20;
  MutexLock lock;
  TestInfo *a_current_test_info_local;
  UnitTest *this_local;
  
  lock.mutex_ = (MutexBase *)a_current_test_info;
  internal::GTestMutexLock::GTestMutexLock(&local_20,&(this->mutex_).super_MutexBase);
  internal::UnitTestImpl::set_current_test_info(this->impl_,(TestInfo *)lock.mutex_);
  internal::GTestMutexLock::~GTestMutexLock(&local_20);
  return;
}

Assistant:

void UnitTest::set_current_test_info(TestInfo* a_current_test_info) {
  internal::MutexLock lock(&mutex_);
  impl_->set_current_test_info(a_current_test_info);
}